

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCAutoArray *
NULLCTypeInfo::GetArrayByType(NULLCAutoArray *__return_storage_ptr__,TypeID id,uint size)

{
  NULLCArray NVar1;
  char *local_30;
  NULLCArray arr;
  uint size_local;
  TypeID id_local;
  
  memset(__return_storage_ptr__,0,0x10);
  if (id.typeID != 0) {
    NVar1 = nullcAllocateArrayTyped(id.typeID,size);
    local_30 = NVar1.ptr;
    __return_storage_ptr__->len = size;
    __return_storage_ptr__->typeID = id.typeID;
    __return_storage_ptr__->ptr = local_30;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCAutoArray GetArrayByType(TypeID id, unsigned size)
	{
		NULLCAutoArray r = { 0, 0, 0 };

		if(!id.typeID)
			return r;

		NULLCArray arr = nullcAllocateArrayTyped(id.typeID, size);
		r.len = size;
		r.typeID = id.typeID;
		r.ptr = arr.ptr;
		return r;
	}